

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallelepiped.cpp
# Opt level: O0

void __thiscall
Parallelepiped::Parallelepiped
          (Parallelepiped *this,mat4 *ltw,vec3 *v0,vec3 *v1,vec3 *v2,vec3 *v3,vec3 *v4,vec3 *v5,
          vec3 *v6,vec3 *v7,bool nOut,ColorRGB c)

{
  bool nOut_local;
  vec3 *v3_local;
  vec3 *v2_local;
  vec3 *v1_local;
  vec3 *v0_local;
  mat4 *ltw_local;
  Parallelepiped *this_local;
  ColorRGB c_local;
  
  SceneObject::SceneObject(&this->super_SceneObject,ltw,c);
  (this->super_SceneObject)._vptr_SceneObject = (_func_int **)&PTR__Parallelepiped_00119d18;
  std::vector<Triangle_*,_std::allocator<Triangle_*>_>::vector(&this->triangles);
  glm::detail::tvec3<float>::tvec3(&this->v6);
  glm::detail::tvec3<float>::tvec3(&this->v7);
  glm::detail::tvec3<float>::tvec3(&this->v2);
  glm::detail::tvec3<float>::tvec3(&this->v3);
  glm::detail::tvec3<float>::tvec3(&this->v4);
  glm::detail::tvec3<float>::tvec3(&this->v5);
  glm::detail::tvec3<float>::tvec3(&this->v0);
  glm::detail::tvec3<float>::tvec3(&this->v1);
  glm::detail::tvec3<float>::operator=(&this->v0,v0);
  glm::detail::tvec3<float>::operator=(&this->v1,v1);
  glm::detail::tvec3<float>::operator=(&this->v2,v2);
  glm::detail::tvec3<float>::operator=(&this->v3,v3);
  glm::detail::tvec3<float>::operator=(&this->v4,v4);
  glm::detail::tvec3<float>::operator=(&this->v5,v5);
  glm::detail::tvec3<float>::operator=(&this->v6,v6);
  glm::detail::tvec3<float>::operator=(&this->v7,v7);
  this->normalsOut = nOut;
  _calculateTriangles(this);
  return;
}

Assistant:

Parallelepiped::Parallelepiped(
        const glm::mat4 &ltw,
        glm::vec3 v0, 
        glm::vec3 v1, 
        glm::vec3 v2, 
        glm::vec3 v3, 
        glm::vec3 v4, 
        glm::vec3 v5, 
        glm::vec3 v6, 
        glm::vec3 v7,
        bool nOut,
        ColorRGB c) : SceneObject(ltw, c) {
    
    this->v0 = v0;
    this->v1 = v1;
    this->v2 = v2;
    this->v3 = v3;
    this->v4 = v4;
    this->v5 = v5;
    this->v6 = v6;
    this->v7 = v7;
    normalsOut = nOut;
    
    _calculateTriangles();
}